

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O2

void unlink_easy(Curl_multi *multi,Curl_easy *data)

{
  Curl_easy *pCVar1;
  Curl_easy *pCVar2;
  Curl_easy **ppCVar3;
  Curl_easy **ppCVar4;
  
  pCVar1 = data->next;
  pCVar2 = data->prev;
  ppCVar4 = &pCVar2->next;
  if (pCVar2 == (Curl_easy *)0x0) {
    ppCVar4 = &multi->easyp;
  }
  ppCVar3 = &pCVar1->prev;
  if (pCVar1 == (Curl_easy *)0x0) {
    ppCVar3 = &multi->easylp;
  }
  *ppCVar4 = pCVar1;
  *ppCVar3 = pCVar2;
  data->next = (Curl_easy *)0x0;
  data->prev = (Curl_easy *)0x0;
  return;
}

Assistant:

static void unlink_easy(struct Curl_multi *multi,
                        struct Curl_easy *data)
{
  /* make the previous node point to our next */
  if(data->prev)
    data->prev->next = data->next;
  else
    multi->easyp = data->next; /* point to first node */

  /* make our next point to our previous node */
  if(data->next)
    data->next->prev = data->prev;
  else
    multi->easylp = data->prev; /* point to last node */

  data->prev = data->next = NULL;
}